

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall capnp::_::RpcSystemBase::Impl::~Impl(Impl *this)

{
  HashBucket *pHVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Entry *pEVar4;
  RemoveConst<kj::HashMap<capnp::_::VatNetworkBase::Connection_*,_kj::Own<capnp::_::RpcSystemBase::RpcConnectionState>_>::Entry>
  *pRVar5;
  Entry *pEVar6;
  RpcSystemBrand *pRVar7;
  Disposer *pDVar8;
  PromiseArenaMember *node;
  Iface *pIVar9;
  ClientHook *pCVar10;
  
  pHVar1 = (this->connections).table.indexes.buckets.ptr;
  if (pHVar1 != (HashBucket *)0x0) {
    sVar2 = (this->connections).table.indexes.buckets.size_;
    (this->connections).table.indexes.buckets.ptr = (HashBucket *)0x0;
    (this->connections).table.indexes.buckets.size_ = 0;
    pAVar3 = (this->connections).table.indexes.buckets.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pHVar1,8,sVar2,sVar2,0);
  }
  pEVar4 = (this->connections).table.rows.builder.ptr;
  if (pEVar4 != (Entry *)0x0) {
    pRVar5 = (this->connections).table.rows.builder.pos;
    pEVar6 = (this->connections).table.rows.builder.endPtr;
    (this->connections).table.rows.builder.ptr = (Entry *)0x0;
    (this->connections).table.rows.builder.pos =
         (RemoveConst<kj::HashMap<capnp::_::VatNetworkBase::Connection_*,_kj::Own<capnp::_::RpcSystemBase::RpcConnectionState>_>::Entry>
          *)0x0;
    (this->connections).table.rows.builder.endPtr = (Entry *)0x0;
    pAVar3 = (this->connections).table.rows.builder.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pEVar4,0x18,((long)pRVar5 - (long)pEVar4 >> 3) * -0x5555555555555555,
               ((long)pEVar6 - (long)pEVar4 >> 3) * -0x5555555555555555,
               kj::ArrayDisposer::
               Dispose_<kj::HashMap<capnp::_::VatNetworkBase::Connection_*,_kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>_>::Entry>
               ::destruct);
  }
  kj::TaskSet::~TaskSet(&this->tasks);
  pRVar7 = (this->brand).ptr;
  if (pRVar7 != (RpcSystemBrand *)0x0) {
    (this->brand).ptr = (RpcSystemBrand *)0x0;
    pDVar8 = (this->brand).disposer;
    (**pDVar8->_vptr_Disposer)
              (pDVar8,(pRVar7->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                      (long)&(pRVar7->super_Refcounted).super_Disposer._vptr_Disposer);
  }
  node = &((this->acceptLoopPromise).super_PromiseBase.node.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->acceptLoopPromise).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  if (((this->traceEncoder).ptr.isSet == true) &&
     (pIVar9 = (this->traceEncoder).ptr.field_1.value.impl.ptr, pIVar9 != (Iface *)0x0)) {
    (this->traceEncoder).ptr.field_1.value.impl.ptr = (Iface *)0x0;
    pDVar8 = (this->traceEncoder).ptr.field_1.value.impl.disposer;
    (**pDVar8->_vptr_Disposer)(pDVar8,pIVar9->_vptr_Iface[-2] + (long)&pIVar9->_vptr_Iface);
  }
  if (((this->bootstrapInterface).ptr.isSet == true) &&
     (pCVar10 = (this->bootstrapInterface).ptr.field_1.value.hook.ptr, pCVar10 != (ClientHook *)0x0)
     ) {
    (this->bootstrapInterface).ptr.field_1.value.hook.ptr = (ClientHook *)0x0;
    pDVar8 = (this->bootstrapInterface).ptr.field_1.value.hook.disposer;
    (**pDVar8->_vptr_Disposer)
              (pDVar8,(_func_int *)
                      ((long)&pCVar10->_vptr_ClientHook + (long)pCVar10->_vptr_ClientHook[-2]));
    return;
  }
  return;
}

Assistant:

Impl(VatNetworkBase& network, kj::Maybe<Capability::Client> bootstrapInterface)
      : network(network), bootstrapInterface(kj::mv(bootstrapInterface)),
        bootstrapFactory(*this), tasks(*this) {
    acceptLoopPromise = acceptLoop().eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
  }